

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O1

void __thiscall
ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
stop(Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
     *this)

{
  void *__src;
  long lVar1;
  uint uVar2;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **__dest;
  undefined8 *extraout_RDX;
  void *in_RSI;
  new_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *this_00;
  size_t sVar3;
  void *__dest_00;
  
  uVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m);
  if (uVar2 == 0) {
    this->to_stop = true;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m);
    return;
  }
  this_00 = (new_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             *)(ulong)uVar2;
  std::__throw_system_error(uVar2);
  __n = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
        ::_M_check_len((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                        *)this_00,1,"vector::_M_realloc_insert");
  __src = *(void **)this_00;
  lVar1 = *(long *)(this_00 + 8);
  sVar3 = (long)in_RSI - (long)__src;
  if (__n == 0) {
    __dest = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  }
  else {
    __dest = __gnu_cxx::
             new_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
             ::allocate(this_00,__n,(void *)0x0);
  }
  __dest[(long)sVar3 >> 3] =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*extraout_RDX;
  if (0 < (long)sVar3) {
    memmove(__dest,__src,sVar3);
  }
  __dest_00 = (void *)((long)__dest + sVar3 + 8);
  sVar3 = lVar1 - (long)in_RSI;
  if (0 < (long)sVar3) {
    memmove(__dest_00,in_RSI,sVar3);
  }
  if (__src != (void *)0x0) {
    operator_delete(__src,*(long *)(this_00 + 0x10) - (long)__src);
  }
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)this_00 = __dest;
  *(size_t *)(this_00 + 8) = (long)__dest_00 + sVar3;
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)(this_00 + 0x10) =
       __dest + __n;
  return;
}

Assistant:

void stop()
		{
			std::lock_guard<std::mutex> l{m};
			to_stop = true;
		}